

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

cmListFileBacktrace * __thiscall cmTarget::GetUtilityBacktrace(cmTarget *this,string *u)

{
  const_iterator cVar1;
  _Base_ptr p_Var2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
          ::find(&(this->UtilityBacktraces)._M_t,u);
  p_Var2 = (_Base_ptr)0x0;
  if ((_Rb_tree_header *)cVar1._M_node !=
      &(this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header) {
    p_Var2 = cVar1._M_node + 2;
  }
  return (cmListFileBacktrace *)p_Var2;
}

Assistant:

cmListFileBacktrace const* cmTarget::GetUtilityBacktrace(
  const std::string& u) const
{
  std::map<std::string, cmListFileBacktrace>::const_iterator i =
    this->UtilityBacktraces.find(u);
  if (i == this->UtilityBacktraces.end()) {
    return CM_NULLPTR;
  }

  return &i->second;
}